

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O3

ChannelList *
anon_unknown.dwarf_24e8db::setupBuffer
          (ChannelList *__return_storage_ptr__,Header *hdr,char **channels,char **passivechannels,
          PixelType *pt,FrameBuffer *buf,FrameBuffer *prereadbuf,FrameBuffer *postreadbuf,int banks,
          bool writing)

{
  _Rb_tree_header *p_Var1;
  char **ppcVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  Box2i *pBVar11;
  size_t xst;
  size_t yst;
  ChannelList *pCVar12;
  bool bVar13;
  long *plVar14;
  ulong uVar15;
  uint uVar16;
  PixelType PVar17;
  vector<char,_std::allocator<char>_> *this;
  uif *puVar18;
  uif *puVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  undefined1 xtc;
  char *pcVar24;
  int iVar25;
  ulong uVar26;
  uint uVar27;
  ulong uVar28;
  Slice local_68;
  ulong uVar23;
  
  pBVar11 = Imf_2_5::Header::dataWindow(hdr);
  iVar3 = (pBVar11->min).x;
  iVar4 = (pBVar11->min).y;
  iVar22 = (pBVar11->max).x;
  lVar20 = 0;
  if (*channels == (char *)0x0) {
    bVar13 = false;
    iVar9 = 0;
    uVar26 = 0;
  }
  else {
    iVar9 = 0;
    bVar13 = false;
    uVar15 = 0;
    do {
      if (pt == (PixelType *)0x0) {
LAB_001887cf:
        iVar9 = iVar9 + 2;
      }
      else {
        PVar17 = pt[uVar15];
        if ((PVar17 != UINT) && (PVar17 != FLOAT)) {
          if (PVar17 == HALF) goto LAB_001887cf;
          goto LAB_00188c3a;
        }
        iVar9 = iVar9 + (-iVar9 & 3U) + 4;
        bVar13 = true;
      }
      uVar26 = uVar15 + 1;
      lVar21 = uVar15 + 1;
      uVar15 = uVar26;
    } while (channels[lVar21] != (char *)0x0);
  }
  uVar15 = uVar26 & 0xffffffff;
  if ((passivechannels != (char **)0x0) && (*passivechannels != (char *)0x0)) {
    lVar21 = 0;
LAB_0018882e:
    if (pt == (PixelType *)0x0) {
LAB_0018884b:
      iVar9 = iVar9 + 2;
    }
    else {
      PVar17 = pt[uVar15 + lVar21];
      if ((PVar17 != UINT) && (PVar17 != FLOAT)) {
        if (PVar17 == HALF) goto LAB_0018884b;
LAB_00188c3a:
        std::operator<<((ostream *)&std::cout,"Unexpected PixelType?\n");
LAB_00188c4d:
        exit(1);
      }
      iVar9 = iVar9 + (-iVar9 & 3U) + 4;
      bVar13 = true;
    }
    lVar20 = lVar21 + 1;
    lVar8 = lVar21 + 1;
    lVar21 = lVar20;
    if (passivechannels[lVar8] == (char *)0x0) goto LAB_0018886a;
    goto LAB_0018882e;
  }
LAB_0018886a:
  uVar16 = -iVar9 & 3;
  if (!bVar13) {
    uVar16 = 0;
  }
  iVar9 = uVar16 + iVar9;
  uVar16 = (int)lVar20 + (int)uVar26;
  pBVar11 = Imf_2_5::Header::dataWindow(hdr);
  iVar25 = (pBVar11->max).x;
  pBVar11 = Imf_2_5::Header::dataWindow(hdr);
  iVar5 = (pBVar11->min).x;
  pBVar11 = Imf_2_5::Header::dataWindow(hdr);
  iVar6 = (pBVar11->max).y;
  pBVar11 = Imf_2_5::Header::dataWindow(hdr);
  iVar25 = ((iVar25 - iVar5) + 1) * uVar16 * ((iVar6 - (pBVar11->min).y) + 1);
  this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer;
  if (writing) {
    this = (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::writingBuffer;
  }
  std::vector<char,_std::allocator<char>_>::resize(this,(long)(iVar25 * iVar9));
  if (0 < iVar25) {
    puVar18 = (uif *)(this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    uVar27 = 0;
    do {
      uVar10 = random_int(0xffff);
      if ((pt == (PixelType *)0x0) || (pt[(int)uVar27] == HALF)) {
        *(short *)puVar18 = (short)uVar10;
        puVar18 = (uif *)((long)puVar18 + 2);
      }
      else {
        puVar19 = (uif *)((long)puVar18 + (ulong)(-(int)puVar18 & 3));
        puVar18 = puVar19 + 1;
        *puVar19 = half::_toFloat[uVar10 & 0xffff];
      }
      uVar27 = uVar27 + 1;
      if (uVar27 == uVar16) {
        uVar27 = 0;
      }
      iVar25 = iVar25 + -1;
    } while (iVar25 != 0);
  }
  if (!writing) {
    std::vector<char,_std::allocator<char>_>::operator=
              ((vector<char,_std::allocator<char>_> *)(anonymous_namespace)::preReadBuffer,
               (vector<char,_std::allocator<char>_> *)&(anonymous_namespace)::readingBuffer);
  }
  p_Var1 = &(__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  iVar22 = iVar9 * ((iVar22 - iVar3) + 1);
  pCVar12 = (ChannelList *)((long)iVar22 / (long)banks & 0xffffffff);
  if (uVar16 != 0) {
    xst = (size_t)(iVar9 / banks);
    yst = (size_t)iVar22;
    ppcVar2 = passivechannels + -(long)(int)uVar26;
    uVar26 = 0;
    pcVar24 = (char *)0x0;
    do {
      PVar17 = HALF;
      if (pt != (PixelType *)0x0) {
        PVar17 = pt[uVar26];
      }
      if (uVar26 < uVar15 && writing) {
        pcVar7 = channels[uVar26];
        Imf_2_5::Channel::Channel((Channel *)&local_68,PVar17,1,1,false);
        Imf_2_5::ChannelList::insert(__return_storage_ptr__,pcVar7,(Channel *)&local_68);
      }
      uVar23 = 0;
      uVar28 = (ulong)(uint)((int)uVar26 >> 0x1f) << 0x20 | uVar26 & 0xffffffff;
      if ((int)((long)uVar28 % (long)((int)uVar16 / banks)) == 0) {
        plVar14 = &(anonymous_namespace)::readingBuffer;
        if (writing) {
          plVar14 = &(anonymous_namespace)::writingBuffer;
        }
        pcVar24 = (char *)(((long)((int)((long)uVar28 / (long)((int)uVar16 / banks)) *
                                  (int)((long)iVar22 / (long)banks)) + *plVar14) -
                          (long)(iVar4 * iVar22 + iVar3 * (iVar9 / banks)));
      }
      uVar28 = (ulong)(-(int)pcVar24 & 3);
      if ((PVar17 & ~FLOAT) != UINT) {
        uVar28 = uVar23;
      }
      pcVar24 = pcVar24 + uVar28;
      if (uVar26 < uVar15) {
        pcVar7 = channels[uVar26];
        iVar25 = (int)uVar26 + 100;
        Imf_2_5::Slice::Slice
                  (&local_68,PVar17,pcVar24,xst,yst,1,1,(double)iVar25,false,SUB41(iVar25,0));
        Imf_2_5::FrameBuffer::insert(buf,pcVar7,&local_68);
      }
      else if (!writing) {
        pcVar7 = ppcVar2[uVar26];
        Imf_2_5::Slice::Slice(&local_68,PVar17,pcVar24,xst,yst,1,1,0.4,false,SUB81(ppcVar2,0));
        xtc = (undefined1)uVar23;
        Imf_2_5::FrameBuffer::insert(postreadbuf,pcVar7,&local_68);
        pcVar7 = ppcVar2[uVar26];
        Imf_2_5::Slice::Slice
                  (&local_68,PVar17,
                   pcVar24 + ((anonymous_namespace)::preReadBuffer._0_8_ -
                             (anonymous_namespace)::readingBuffer),xst,yst,1,1,0.4,(bool)xtc,false);
        Imf_2_5::FrameBuffer::insert(prereadbuf,pcVar7,&local_68);
      }
      pCVar12 = (ChannelList *)0x2;
      if (PVar17 != HALF) {
        if (PVar17 != FLOAT) {
          std::operator<<((ostream *)&std::cout,"Unexpected Pixel Type\n");
          goto LAB_00188c4d;
        }
        pCVar12 = (ChannelList *)0x4;
      }
      pcVar24 = pcVar24 + (long)pCVar12;
      uVar26 = uVar26 + 1;
    } while (uVar16 != uVar26);
  }
  return pCVar12;
}

Assistant:

ChannelList
setupBuffer (const Header& hdr,       // header to grab datawindow from
             const char * const *channels, // NULL terminated list of channels to write
             const char * const *passivechannels, // NULL terminated list of channels to write
             const PixelType* pt,     // type of each channel, or NULL for all HALF
             FrameBuffer& buf,        // buffer to fill with pointers to channel
             FrameBuffer& prereadbuf, // channels which aren't being read - indexes into the preread buffer
             FrameBuffer& postreadbuf, // channels which aren't being read - indexes into the postread buffer
             int banks,                    // number of banks - channels within each bank are interleaved, banks are scanline interleaved
             bool writing                  // true if should allocate
            )
{
    Box2i dw = hdr.dataWindow();

    //
    // how many channels in total
    //
    int activechans = 0;
    int bytes_per_pixel =0;
    bool has32BitValue = false;
    while (channels[activechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    // some architectures (e.g arm7 cannot write 32 bit values
                    // to addresses which aren't aligned to 32 bit addresses)
                    // so bump to next multiple of four
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                    
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        activechans++;
    }

    
    int passivechans=0;
    while (passivechannels!=NULL && passivechannels[passivechans]!=NULL)
    {
        if (pt==NULL)
        {
            bytes_per_pixel+=2;
        }
        else
        {
            switch (pt[passivechans+activechans])
            {
                case IMF::HALF : bytes_per_pixel+=2;break;
                case IMF::FLOAT : case IMF::UINT : 
                    bytes_per_pixel =  alignToFour(bytes_per_pixel);
                    bytes_per_pixel+=4;
                    has32BitValue = true;
                    break;
                default :
                    cout << "Unexpected PixelType?\n";
                    exit(1);
            }
        }
        passivechans++;
    }
    
    if(has32BitValue)
    {
        bytes_per_pixel = alignToFour(bytes_per_pixel);
    }

   int chans = activechans+passivechans;

    
    int bytes_per_bank = bytes_per_pixel/banks;
    
    int samples = (hdr.dataWindow().max.x+1-hdr.dataWindow().min.x)*
                  (hdr.dataWindow().max.y+1-hdr.dataWindow().min.y)*chans;

    int size = samples*bytes_per_pixel;

    
    if (writing)
    {
        writingBuffer.resize(size);
    }
    else
    {
        readingBuffer.resize(size);
    }
   
     const char * write_ptr = writing ? &writingBuffer[0] : &readingBuffer[0];
     // fill with random halfs, casting to floats for float channels
     int chan=0;
     for (int i=0;i<samples;i++)
     {
         unsigned short int values = random_int(std::numeric_limits<unsigned short>::max());
         half v;
         v.setBits(values);
         if (pt==NULL || pt[chan]==IMF::HALF)
         {
             *(half*)write_ptr = half(v);
             write_ptr+=2;
         }
         else
         {
             write_ptr = alignToFour(write_ptr);
             *(float*)write_ptr = float(v);
             
             write_ptr+=4;
         }
         chan++;
         if (chan==chans)
         {
             chan=0;
         }
     
     }

     if (!writing)
     {
         //take a copy of the buffer as it was before being read
         preReadBuffer = readingBuffer;
     }
     
    char* offset=NULL;

    ChannelList chanlist;

    int bytes_per_row = bytes_per_pixel*(dw.max.x+1-dw.min.x);
    int bytes_per_bank_row = bytes_per_row/banks;
    
    int first_pixel_index = bytes_per_row*dw.min.y+bytes_per_bank*dw.min.x;
    
    for (int i=0;i<chans;i++)
    {
        PixelType type = pt==NULL ? IMF::HALF : pt[i];
        if (i<activechans && writing)
        {
            chanlist.insert(channels[i],type);
        }


        if (i % (chans/banks) ==0)
        {
            //
            // set offset pointer to beginning of bank
            //

            int bank = i / (chans/banks);
            offset = (writing ? &writingBuffer[0] :
                                &readingBuffer[0]) + bank*bytes_per_bank_row - first_pixel_index;
        }
       

         if(type==FLOAT || type==UINT)
         {
           offset = alignToFour(offset);
         }
 
        if (i<activechans)
        {
            
            buf.insert (channels[i],
                        Slice (type,
                               offset,
                               bytes_per_bank,
                               bytes_per_row,
                               1,1,100+i));
        }
        else
        {
            if (!writing)
            {
                
                postreadbuf.insert (passivechannels[i-activechans],
                                    Slice (type,
                                           offset,
                                           bytes_per_bank,
                                           bytes_per_row,
                                           1,1,0.4));

                char * pre_offset = offset-&readingBuffer[0]+&preReadBuffer[0];
 
                prereadbuf.insert (passivechannels[i-activechans],
                                   Slice (type,
                                          pre_offset,
                                          bytes_per_bank,
                                          bytes_per_row,
                                          1,1,0.4));
            }
        }
        switch (type)
        {
            case IMF::HALF :
                offset+=2;
                break;
            case IMF::FLOAT :
                offset+=4;
                break;
            default :
                cout << "Unexpected Pixel Type\n";
                exit(1);
        
        }
    }

    return chanlist;
}